

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfont.cpp
# Opt level: O2

bool __thiscall QFontInfo::fixedPitch(QFontInfo *this)

{
  QFontEngine *pQVar1;
  
  pQVar1 = QFontPrivate::engineForScript((this->d).d.ptr,2);
  return (bool)(((pQVar1->fontDef).field_0x66 & 4) >> 2);
}

Assistant:

bool QFontInfo::fixedPitch() const
{
    QFontEngine *engine = d->engineForScript(QChar::Script_Common);
    Q_ASSERT(engine != nullptr);
#ifdef Q_OS_MAC
    if (!engine->fontDef.fixedPitchComputed) {
        QChar ch[2] = { u'i', u'm' };
        QGlyphLayoutArray<2> g;
        int l = 2;
        if (engine->stringToCMap(ch, 2, &g, &l, {}) < 0)
            Q_UNREACHABLE();
        Q_ASSERT(l == 2);
        engine->fontDef.fixedPitch = g.advances[0] == g.advances[1];
        engine->fontDef.fixedPitchComputed = true;
    }
#endif
    return engine->fontDef.fixedPitch;
}